

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::AddRawTransactionRequest::AddRawTransactionRequest
          (AddRawTransactionRequest *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_29;
  
  (this->super_JsonClassBase<cfd::js::api::json::AddRawTransactionRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__AddRawTransactionRequest_00b36e00;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->tx_,"",&local_29);
  (this->txins_).super_JsonVector<cfd::js::api::json::TxInRequest>.
  super_vector<cfd::js::api::json::TxInRequest,_std::allocator<cfd::js::api::json::TxInRequest>_>.
  super__Vector_base<cfd::js::api::json::TxInRequest,_std::allocator<cfd::js::api::json::TxInRequest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::TxInRequest>.
  super_vector<cfd::js::api::json::TxInRequest,_std::allocator<cfd::js::api::json::TxInRequest>_>.
  super__Vector_base<cfd::js::api::json::TxInRequest,_std::allocator<cfd::js::api::json::TxInRequest>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::TxInRequest>.
  super_vector<cfd::js::api::json::TxInRequest,_std::allocator<cfd::js::api::json::TxInRequest>_>.
  super__Vector_base<cfd::js::api::json::TxInRequest,_std::allocator<cfd::js::api::json::TxInRequest>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txins_).super_JsonVector<cfd::js::api::json::TxInRequest>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b36a70;
  (this->txouts_).super_JsonVector<cfd::js::api::json::TxOutRequest>.
  super_vector<cfd::js::api::json::TxOutRequest,_std::allocator<cfd::js::api::json::TxOutRequest>_>.
  super__Vector_base<cfd::js::api::json::TxOutRequest,_std::allocator<cfd::js::api::json::TxOutRequest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txouts_).super_JsonVector<cfd::js::api::json::TxOutRequest>.
  super_vector<cfd::js::api::json::TxOutRequest,_std::allocator<cfd::js::api::json::TxOutRequest>_>.
  super__Vector_base<cfd::js::api::json::TxOutRequest,_std::allocator<cfd::js::api::json::TxOutRequest>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txouts_).super_JsonVector<cfd::js::api::json::TxOutRequest>.
  super_vector<cfd::js::api::json::TxOutRequest,_std::allocator<cfd::js::api::json::TxOutRequest>_>.
  super__Vector_base<cfd::js::api::json::TxOutRequest,_std::allocator<cfd::js::api::json::TxOutRequest>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txouts_).super_JsonVector<cfd::js::api::json::TxOutRequest>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00b36bb8;
  CollectFieldName();
  return;
}

Assistant:

AddRawTransactionRequest() {
    CollectFieldName();
  }